

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O2

void __thiscall duckdb::CSVReaderOptions::SetEscape(CSVReaderOptions *this,string *input)

{
  InvalidInputException *this_00;
  allocator local_59;
  string local_58;
  string escape_str;
  
  ::std::__cxx11::string::string((string *)&escape_str,(string *)input);
  if (escape_str._M_string_length < 2) {
    if (escape_str._M_string_length == 0) {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      local_58.field_2._M_allocated_capacity._0_2_ = 0;
      local_58._M_string_length = 1;
      ::std::__cxx11::string::operator=((string *)&escape_str,(string *)&local_58);
      ::std::__cxx11::string::~string((string *)&local_58);
    }
    if ((this->dialect_options).state_machine_options.escape.set_by_user == false) {
      (this->dialect_options).state_machine_options.escape.value = *escape_str._M_dataplus._M_p;
      (this->dialect_options).state_machine_options.escape.set_by_user = true;
    }
    ::std::__cxx11::string::~string((string *)&escape_str);
    return;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_58,"The escape option cannot exceed a size of 1 byte.",&local_59);
  InvalidInputException::InvalidInputException(this_00,&local_58);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CSVReaderOptions::SetEscape(const string &input) {
	auto escape_str = input;
	if (escape_str.size() > 1) {
		throw InvalidInputException("The escape option cannot exceed a size of 1 byte.");
	}
	if (escape_str.empty()) {
		escape_str = string("\0", 1);
	}
	this->dialect_options.state_machine_options.escape.Set(escape_str[0]);
}